

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_base64_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  mime_encoder_state *pmVar4;
  size_t sVar5;
  char *pcVar6;
  char *local_50;
  char *ptr;
  size_t sStack_40;
  int i;
  size_t cursize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  pmVar4 = &part->encstate;
  sStack_40 = 0;
  local_50 = buffer;
  sStack_20 = size;
  do {
    if ((part->encstate).bufend <= (part->encstate).bufbeg) {
LAB_00161899:
      if (ateof) {
        if (sStack_20 < 4) {
          if (sStack_40 == 0) {
            return 0xfffffffffffffffe;
          }
        }
        else {
          local_50[3] = '=';
          local_50[2] = '=';
          ptr._4_4_ = 0;
          if ((part->encstate).bufend != (part->encstate).bufbeg) {
            if ((part->encstate).bufend - (part->encstate).bufbeg == 2) {
              ptr._4_4_ = (uint)(byte)(part->encstate).buf[(part->encstate).bufbeg + 1] << 8;
            }
            uVar3 = (uint)(byte)(part->encstate).buf[(part->encstate).bufbeg] << 0x10 | ptr._4_4_;
            *local_50 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                        [(int)uVar3 >> 0x12];
            local_50[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                          [(int)((int)uVar3 >> 0xc & 0x3f)];
            sVar5 = (part->encstate).bufbeg + 1;
            (part->encstate).bufbeg = sVar5;
            if (sVar5 != (part->encstate).bufend) {
              local_50[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                            [(int)((int)uVar3 >> 6 & 0x3f)];
              (part->encstate).bufbeg = (part->encstate).bufbeg + 1;
            }
            sStack_40 = sStack_40 + 4;
            pmVar4->pos = pmVar4->pos + 4;
          }
        }
      }
      return sStack_40;
    }
    if (0x48 < pmVar4->pos) {
      if (sStack_20 < 2) {
        if (sStack_40 == 0) {
          return 0xfffffffffffffffe;
        }
        goto LAB_00161899;
      }
      pcVar6 = local_50 + 1;
      *local_50 = '\r';
      local_50 = local_50 + 2;
      *pcVar6 = '\n';
      pmVar4->pos = 0;
      sStack_40 = sStack_40 + 2;
      sStack_20 = sStack_20 - 2;
    }
    if (sStack_20 < 4) {
      if (sStack_40 == 0) {
        return 0xfffffffffffffffe;
      }
      goto LAB_00161899;
    }
    if ((part->encstate).bufend - (part->encstate).bufbeg < 3) goto LAB_00161899;
    sVar5 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar5 + 1;
    cVar1 = (part->encstate).buf[sVar5];
    sVar5 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar5 + 1;
    cVar2 = (part->encstate).buf[sVar5];
    sVar5 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar5 + 1;
    uVar3 = (uint)CONCAT21(CONCAT11(cVar1,cVar2),(part->encstate).buf[sVar5]);
    *local_50 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)uVar3 >> 0x12];
    local_50[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar3 >> 0xc & 0x3f)];
    pcVar6 = local_50 + 3;
    local_50[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar3 >> 6 & 0x3f)];
    local_50 = local_50 + 4;
    *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(int)(uVar3 & 0x3f)];
    sStack_40 = sStack_40 + 4;
    pmVar4->pos = pmVar4->pos + 4;
    sStack_20 = sStack_20 - 4;
  } while( true );
}

Assistant:

static size_t encoder_base64_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t cursize = 0;
  int i;
  char *ptr = buffer;

  while(st->bufbeg < st->bufend) {
    /* Line full ? */
    if(st->pos > MAX_ENCODED_LINE_LENGTH - 4) {
      /* Yes, we need 2 characters for CRLF. */
      if(size < 2) {
        if(!cursize)
          return STOP_FILLING;
        break;
      }
      *ptr++ = '\r';
      *ptr++ = '\n';
      st->pos = 0;
      cursize += 2;
      size -= 2;
    }

    /* Be sure there is enough space and input data for a base64 group. */
    if(size < 4) {
      if(!cursize)
        return STOP_FILLING;
      break;
    }
    if(st->bufend - st->bufbeg < 3)
      break;

    /* Encode three bytes as four characters. */
    i = st->buf[st->bufbeg++] & 0xFF;
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    *ptr++ = base64enc[(i >> 18) & 0x3F];
    *ptr++ = base64enc[(i >> 12) & 0x3F];
    *ptr++ = base64enc[(i >> 6) & 0x3F];
    *ptr++ = base64enc[i & 0x3F];
    cursize += 4;
    st->pos += 4;
    size -= 4;
  }

  /* If at eof, we have to flush the buffered data. */
  if(ateof) {
    if(size < 4) {
      if(!cursize)
        return STOP_FILLING;
    }
    else {
      /* Buffered data size can only be 0, 1 or 2. */
      ptr[2] = ptr[3] = '=';
      i = 0;

      /* If there is buffered data */
      if(st->bufend != st->bufbeg) {

        if(st->bufend - st->bufbeg == 2)
          i = (st->buf[st->bufbeg + 1] & 0xFF) << 8;

        i |= (st->buf[st->bufbeg] & 0xFF) << 16;
        ptr[0] = base64enc[(i >> 18) & 0x3F];
        ptr[1] = base64enc[(i >> 12) & 0x3F];
        if(++st->bufbeg != st->bufend) {
          ptr[2] = base64enc[(i >> 6) & 0x3F];
          st->bufbeg++;
        }
        cursize += 4;
        st->pos += 4;
      }
    }
  }

  return cursize;
}